

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O0

void __thiscall
StringWriter_WriteMaxTwoByteLengthCharString_Test::TestBody
          (StringWriter_WriteMaxTwoByteLengthCharString_Test *this)

{
  allocator<unsigned_char> *paVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __first;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  reference puVar5;
  iterator __last;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *matcher;
  AssertHelper local_1f0;
  Message local_1e8;
  size_t local_1e0;
  size_type local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_5;
  Message local_1b8;
  size_t local_1b0;
  size_type local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_4;
  Message local_188;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_180;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_168;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_138 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_body;
  undefined1 local_108 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> body;
  Message local_e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  iterator first;
  Message local_80;
  size_type local_78;
  unsigned_long local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  allocator local_41;
  undefined1 local_40 [8];
  string str;
  char src_char;
  size_type src_length;
  StringWriter_WriteMaxTwoByteLengthCharString_Test *this_local;
  
  str.field_2._M_local_buf[0xf] = 'a';
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,0x3fff,'a',&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pstore::serialize::write<pstore::serialize::archive::vector_writer&,std::__cxx11::string>
            (&(this->super_StringWriter).writer_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  lVar3 = std::__cxx11::string::length();
  local_70 = lVar3 + 2;
  local_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (&(this->super_StringWriter).bytes_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_68,"str.length () + 2","bytes_.size ()",&local_70,&local_78);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_80);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x44,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&first,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&first);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::begin<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   (&(this->super_StringWriter).bytes_);
  local_a4 = 0xfe;
  local_b0 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&gtest_ar_1.message_,0);
  puVar5 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator*(&local_b0);
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_a0,"0b11111110","*(first++)",&local_a4,puVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(&local_b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x46,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_d4 = 0xff;
  local_e0 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&gtest_ar_1.message_,0);
  puVar5 = __gnu_cxx::
           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator*(&local_e0);
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_d0,"0b11111111","*(first++)",&local_d4,puVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x47,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  __first = gtest_ar_1.message_;
  __last = std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     (&(this->super_StringWriter).bytes_);
  paVar1 = (allocator<unsigned_char> *)
           ((long)&expected_body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_108,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current,paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&expected_body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 0x61;
  paVar1 = (allocator<unsigned_char> *)
           ((long)&gtest_ar_3.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 6);
  std::allocator<unsigned_char>::allocator(paVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138,0x3fff,
             (value_type *)
             ((long)&gtest_ar_3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7),paVar1);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&gtest_ar_3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6));
  testing::ContainerEq<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_180,(testing *)local_138,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            (&local_168,(internal *)&local_180,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::operator()(local_150,(char *)&local_168,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d5308);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_168);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~PolymorphicMatcher(&local_180);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar2) {
    testing::Message::Message(&local_188);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x4b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_1a8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&(this->super_StringWriter).bytes_);
  local_1b0 = pstore::serialize::archive::
              writer_base<pstore::serialize::archive::details::vector_writer_policy>::bytes_consumed
                        (&(this->super_StringWriter).writer_.
                          super_writer_base<pstore::serialize::archive::details::vector_writer_policy>
                        );
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1a0,"bytes_.size ()","writer_.bytes_consumed ()",&local_1a8,
             &local_1b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar2) {
    testing::Message::Message(&local_1b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x4c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1d8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&(this->super_StringWriter).bytes_);
  local_1e0 = pstore::serialize::archive::
              writer_base<pstore::serialize::archive::details::vector_writer_policy>::bytes_produced
                        (&(this->super_StringWriter).writer_.
                          super_writer_base<pstore::serialize::archive::details::vector_writer_policy>
                        );
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1d0,"bytes_.size ()","writer_.bytes_produced ()",&local_1d8,
             &local_1e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x4d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

TEST_F (StringWriter, WriteMaxTwoByteLengthCharString) {
    auto const src_length = three_byte_varint - 1;
    auto const src_char = 'a';
    std::string const str (src_length, src_char);

    pstore::serialize::write (writer_, str);

    EXPECT_EQ (str.length () + 2, bytes_.size ());
    auto first = std::begin (bytes_);
    EXPECT_EQ (0b11111110, *(first++));
    EXPECT_EQ (0b11111111, *(first++));
    std::vector<std::uint8_t> const body (first, std::end (bytes_));
    std::vector<std::uint8_t> const expected_body (src_length, src_char);

    EXPECT_THAT (body, ::testing::ContainerEq (expected_body));
    EXPECT_EQ (bytes_.size (), writer_.bytes_consumed ());
    EXPECT_EQ (bytes_.size (), writer_.bytes_produced ());
}